

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

char * bc_str_rstrip(char *str)

{
  int iVar1;
  size_t sVar2;
  size_t str_len;
  int i;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    sVar2 = strlen(str);
    iVar1 = (int)sVar2;
    do {
      str_len._4_4_ = iVar1 + -1;
      if (str_len._4_4_ < 0) {
        return str;
      }
      if ((((str[str_len._4_4_] != ' ') && (str[str_len._4_4_] != '\t')) &&
          (str[str_len._4_4_] != '\n')) &&
         (((str[str_len._4_4_] != '\r' && (str[str_len._4_4_] != '\t')) &&
          ((str[str_len._4_4_] != '\f' && (str[str_len._4_4_] != '\v')))))) {
        str[iVar1] = '\0';
        return str;
      }
      iVar1 = str_len._4_4_;
    } while (str_len._4_4_ != 0);
    *str = '\0';
    str_local = str;
  }
  return str_local;
}

Assistant:

char*
bc_str_rstrip(char *str)
{
    if (str == NULL)
        return NULL;
    int i;
    size_t str_len = strlen(str);
    for (i = str_len - 1; i >= 0; i--) {
        if ((str[i] != ' ') && (str[i] != '\t') && (str[i] != '\n') &&
            (str[i] != '\r') && (str[i] != '\t') && (str[i] != '\f') &&
            (str[i] != '\v'))
        {
            str[i + 1] = '\0';
            break;
        }
        if (i == 0) {
            str[0] = '\0';
            break;
        }
    }
    return str;
}